

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

void Sbm_AddCardinConstrTest(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  sat_solver *s;
  uint uVar4;
  int Lit;
  Vec_Int_t *local_40;
  Vec_Int_t *vVars;
  
  p = Vec_IntAlloc(8);
  s = Sbm_AddCardinSolver(3,&vVars);
  sat_solver_nvars(s);
  local_40 = vVars;
  iVar1 = Vec_IntEntry(vVars,2);
  uVar4 = 1;
  Lit = Abc_Var2Lit(iVar1,1);
  sat_solver_nclauses(s);
  printf("LogN = %d. N = %3d.   Vars = %5d. Clauses = %6d.  Comb = %d.\n",3,8);
  do {
    iVar1 = sat_solver_solve(s,&Lit,(lit *)&local_40,0,0,0,0);
    if (iVar1 != 1) break;
    p->nSize = 0;
    printf("%3d : ",(ulong)uVar4);
    for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
      iVar2 = sat_solver_var_value(s,iVar1);
      iVar2 = Abc_Var2Lit(iVar1,iVar2);
      Vec_IntPush(p,iVar2);
      uVar3 = sat_solver_var_value(s,iVar1);
      printf("%d",(ulong)uVar3);
    }
    uVar4 = uVar4 + 1;
    putchar(10);
    iVar1 = sat_solver_addclause(s,p->pArray,p->pArray + 8);
  } while (iVar1 != 0);
  sat_solver_delete(s);
  Vec_IntFree(local_40);
  Vec_IntFree(p);
  return;
}

Assistant:

void Sbm_AddCardinConstrTest()
{
    int LogN = 3, nVars = 1 << LogN, K = 2, Count = 1;
    Vec_Int_t * vVars, * vLits = Vec_IntAlloc( nVars );
    sat_solver * pSat = Sbm_AddCardinSolver( LogN, &vVars );
    int nVarsReal = sat_solver_nvars( pSat );

    int Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    printf( "LogN = %d. N = %3d.   Vars = %5d. Clauses = %6d.  Comb = %d.\n", LogN, nVars, nVarsReal, sat_solver_nclauses(pSat), nVars * (nVars-1)/2 + nVars + 1 );
    while ( 1 )
    {
        int i, status = sat_solver_solve( pSat, &Lit, &Lit+1, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vLits );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vLits, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + nVars );
        if ( status == 0 )
            break;
    }

    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
}